

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O0

int64_t __thiscall
disruptor::BusySpinStrategy::WaitFor
          (BusySpinStrategy *this,int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted)

{
  bool bVar1;
  long *in_RSI;
  function<long_()> min_sequence;
  int64_t available_sequence;
  function<long_()> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *in_stack_ffffffffffffffa0;
  Sequence *in_stack_ffffffffffffffa8;
  undefined8 local_8;
  
  buildMinSequenceFunction(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  do {
    in_stack_ffffffffffffff90 =
         (function<long_()> *)std::function<long_()>::operator()(in_stack_ffffffffffffff90);
    local_8 = in_stack_ffffffffffffff90;
    if (*in_RSI <= (long)in_stack_ffffffffffffff90) {
LAB_0011027c:
      std::function<long_()>::~function((function<long_()> *)0x110286);
      return (int64_t)local_8;
    }
    bVar1 = std::atomic<bool>::load
                      ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                       ,(memory_order)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    if (bVar1) {
      local_8 = (function<long_()> *)0xfffffffffffffffe;
      goto LAB_0011027c;
    }
    SpinPause();
  } while( true );
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted) {
    int64_t available_sequence = kInitialCursorValue;
    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      SpinPause();
    }

    return available_sequence;
  }